

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void showProcessInfo(void)

{
  int *piVar1;
  long lVar2;
  _List_node_base *p_Var3;
  ostream *poVar4;
  size_t sVar5;
  long *plVar6;
  
  printSplitLine();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"main process info:",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tnum: ",6);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"details: ",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\tpid \tname\t\t\tmem",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  for (p_Var3 = processList_abi_cxx11_.super__List_base<Process_*,_std::allocator<Process_*>_>.
                _M_impl._M_node.super__List_node_base._M_next;
      p_Var3 != (_List_node_base *)&processList_abi_cxx11_;
      p_Var3 = (((_List_base<Process_*,_std::allocator<Process_*>_> *)&p_Var3->_M_next)->_M_impl).
               _M_node.super__List_node_base._M_next) {
    piVar1 = *(int **)(p_Var3 + 1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
    lVar2 = std::cout;
    *(uint *)(strtok + *(long *)(std::cout + -0x18)) =
         *(uint *)(strtok + *(long *)(std::cout + -0x18)) | 0x20;
    *(undefined8 *)(std::ios_base::Init::Init + *(long *)(lVar2 + -0x18)) = 7;
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    lVar2 = *(long *)poVar4;
    *(uint *)(poVar4 + *(long *)(lVar2 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar2 + -0x18) + 0x18) | 0x20;
    *(undefined8 *)(poVar4 + *(long *)(lVar2 + -0x18) + 0x10) = 0xf;
    sVar5 = strlen((char *)(piVar1 + 1));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)(piVar1 + 1),sVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) | 0x20;
    plVar6 = (long *)std::ostream::operator<<(poVar4,*(int *)(*(long *)(piVar1 + 0xe) + 4));
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    std::ostream::flush();
  }
  if (processList_abi_cxx11_.super__List_base<Process_*,_std::allocator<Process_*>_>._M_impl._M_node
      ._M_size == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tnone",5);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
  }
  printSplitLine();
  return;
}

Assistant:

void showProcessInfo() {
    printSplitLine();
    // 先输出进程数量
    cout << "main process info:" << endl;
    cout << "\tnum: " << processList.size() << endl;
    cout << endl;
    // 输出线程详情
    cout << "details: " << endl;
    cout << "\tpid \tname\t\t\tmem" << endl;
    for (Process *i : processList)
        cout << "\t" << setiosflags(ios::left) << setw(7) << i->pid
             << " " << setiosflags(ios::left) << setw(15) << i->name
             << " " << setiosflags(ios::left) << i->memBlock->length
             << endl;
    if (processList.size() == 0) cout << "\tnone" << endl;
    printSplitLine();
}